

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SwitchArg.h
# Opt level: O0

bool __thiscall
TCLAP::SwitchArg::processArg
          (SwitchArg *this,int *i,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args)

{
  bool bVar1;
  uint uVar2;
  reference pvVar3;
  CmdLineParseException *this_00;
  string local_80;
  allocator<char> local_49;
  string local_48;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_28;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *args_local;
  int *i_local;
  SwitchArg *this_local;
  
  local_28 = args;
  args_local = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)i;
  i_local = (int *)this;
  if ((((this->super_Arg)._ignoreable & 1U) == 0) || (bVar1 = Arg::ignoreRest(), !bVar1)) {
    pvVar3 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[](local_28,(long)*(int *)&(args_local->
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  )._M_impl.super__Vector_impl_data._M_start);
    uVar2 = (*(this->super_Arg)._vptr_Arg[6])(this,pvVar3);
    if ((uVar2 & 1) == 0) {
      pvVar3 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[](local_28,(long)*(int *)&(args_local->
                                                                                                        
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  )._M_impl.super__Vector_impl_data._M_start);
      bVar1 = combinedSwitchesMatch(this,pvVar3);
      if (bVar1) {
        pvVar3 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[](local_28,(long)*(int *)&(args_local->
                                                                                                            
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  )._M_impl.super__Vector_impl_data._M_start);
        bVar1 = combinedSwitchesMatch(this,pvVar3);
        if (bVar1) {
          this_00 = (CmdLineParseException *)__cxa_allocate_exception(0x68);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_48,"Argument already set!",&local_49);
          (*(this->super_Arg)._vptr_Arg[7])(&local_80);
          CmdLineParseException::CmdLineParseException(this_00,&local_48,&local_80);
          __cxa_throw(this_00,&CmdLineParseException::typeinfo,
                      CmdLineParseException::~CmdLineParseException);
        }
        commonProcessing(this);
        pvVar3 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[](local_28,(long)*(int *)&(args_local->
                                                                                                            
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  )._M_impl.super__Vector_impl_data._M_start);
        this_local._7_1_ = lastCombined(this,pvVar3);
      }
      else {
        this_local._7_1_ = false;
      }
    }
    else {
      commonProcessing(this);
      this_local._7_1_ = true;
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

inline bool SwitchArg::processArg(int *i, std::vector<std::string>& args)
{
  if ( _ignoreable && Arg::ignoreRest() )
    return false;

  // if the whole string matches the flag or name string
  if ( argMatches( args[*i] ) )
    {
      commonProcessing();

      return true;
    }
  // if a substring matches the flag as part of a combination
  else if ( combinedSwitchesMatch( args[*i] ) )
    {
      // check again to ensure we don't misinterpret 
      // this as a MultiSwitchArg 
      if ( combinedSwitchesMatch( args[*i] ) )
	throw(CmdLineParseException("Argument already set!", 
				    toString()));

      commonProcessing();

      // We only want to return true if we've found the last combined
      // match in the string, otherwise we return true so that other 
      // switches in the combination will have a chance to match.
      return lastCombined( args[*i] );
    }
  else
    return false;
}